

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O3

ENetPacket * enet_peer_receive(ENetPeer *peer,enet_uint8 *channelID)

{
  ENetListIterator position;
  void *__ptr;
  ENetPacket *pEVar1;
  
  position = (peer->dispatchedCommands).sentinel.next;
  if (position == &(peer->dispatchedCommands).sentinel) {
    pEVar1 = (ENetPacket *)0x0;
  }
  else {
    __ptr = enet_list_remove(position);
    if (channelID != (enet_uint8 *)0x0) {
      *channelID = *(enet_uint8 *)((long)__ptr + 0x15);
    }
    pEVar1 = *(ENetPacket **)((long)__ptr + 0x58);
    pEVar1->referenceCount = pEVar1->referenceCount - 1;
    if (*(void **)((long)__ptr + 0x50) != (void *)0x0) {
      enet_free(*(void **)((long)__ptr + 0x50));
    }
    enet_free(__ptr);
    peer->totalWaitingData = peer->totalWaitingData - pEVar1->dataLength;
  }
  return pEVar1;
}

Assistant:

ENetPacket *
enet_peer_receive (ENetPeer * peer, enet_uint8 * channelID)
{
   ENetIncomingCommand * incomingCommand;
   ENetPacket * packet;
   
   if (enet_list_empty (& peer -> dispatchedCommands))
     return NULL;

   incomingCommand = (ENetIncomingCommand *) enet_list_remove (enet_list_begin (& peer -> dispatchedCommands));

   if (channelID != NULL)
     * channelID = incomingCommand -> command.header.channelID;

   packet = incomingCommand -> packet;

   -- packet -> referenceCount;

   if (incomingCommand -> fragments != NULL)
     enet_free (incomingCommand -> fragments);

   enet_free (incomingCommand);

   peer -> totalWaitingData -= packet -> dataLength;

   return packet;
}